

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

void __thiscall
RandomTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
::RandomTestData(RandomTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                 *this,char16_t in_delim,size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  __normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_38;
  __const_iterator local_30;
  size_t local_28;
  size_t in_fixed_word_length_local;
  size_t in_fixed_word_count_local;
  RandomTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  *pRStack_10;
  char16_t in_delim_local;
  RandomTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  *this_local;
  
  local_28 = in_fixed_word_length;
  in_fixed_word_length_local = in_fixed_word_count;
  in_fixed_word_count_local._6_2_ = in_delim;
  pRStack_10 = this;
  std::__cxx11::u16string::u16string((u16string *)this);
  this->m_fixed_word_count = in_fixed_word_length_local;
  this->m_fixed_word_length = local_28;
  std::__cxx11::u16string::u16string((u16string *)&this->m_str);
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::vector(&this->m_tokens);
  local_38._M_current =
       (char16_t *)
       std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
       end(&this->m_delim);
  __gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>::
  __normal_iterator<char16_t*>
            ((__normal_iterator<char16_t_const*,std::__cxx11::u16string> *)&local_30,&local_38);
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  insert(&this->m_delim,local_30,in_fixed_word_count_local._6_2_);
  populate(this);
  return;
}

Assistant:

RandomTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}